

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O2

void __thiscall MetricsDiscovery::MDHelper::CloseStream(MDHelper *this)

{
  if (((this->m_Initialized == true) && (this->m_ConcurrentGroup != (IConcurrentGroupLatest *)0x0))
     && ((this->m_APIMask & 1) != 0)) {
    (**(code **)(*(long *)this->m_ConcurrentGroup + 0x30))();
    return;
  }
  return;
}

Assistant:

void MDHelper::CloseStream()
{
    if( !m_Initialized || !m_ConcurrentGroup )
    {
        DebugPrint("Can't CloseStream!\n");
        return;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("CloseStream requires API_TYPE_IOSTREAM!\n");
        return;
    }

    TCompletionCode res = m_ConcurrentGroup->CloseIoStream();
    if( res != CC_OK )
    {
        DebugPrint( "CloseStream failed: %d\n", res );
        return;
    }
}